

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

T_INDEX __thiscall
Nova::Grid<float,_2>::Clamp_To_Cell(Grid<float,_2> *this,TV *X,int number_of_ghost_cells)

{
  undefined4 in_register_00000014;
  T_STORAGE local_50;
  T_STORAGE local_40;
  Vector<float,_2,_true> data_copy;
  T_INDEX index;
  
  Vector<float,_2,_true>::operator-
            ((Vector<float,_2,_true> *)&stack0xffffffffffffffc0,
             (Vector<float,_2,_true> *)CONCAT44(in_register_00000014,number_of_ghost_cells));
  data_copy._data._M_elems = (T_STORAGE)(T_STORAGE)local_40._M_elems;
  Vector<float,_2,_true>::operator*=(&data_copy,X + 4);
  Vector<int,_2,_true>::Vector<float>((Vector<int,_2,_true> *)&stack0xffffffffffffffb0,&data_copy);
  index._data._M_elems = (T_STORAGE)(T_STORAGE)local_50._M_elems;
  Vector<int,_2,_true>::operator+=(&index,1);
  Cell_Indices((Grid<float,_2> *)&stack0xffffffffffffffb0,(int)X);
  Range<int,_2>::Clamp((Range<int,_2> *)this,(TV *)&stack0xffffffffffffffb0);
  return (T_INDEX)(T_STORAGE)this;
}

Assistant:

T_INDEX Clamp_To_Cell(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index=T_INDEX((X-domain.min_corner)*one_over_dX)+1;
        return Cell_Indices(number_of_ghost_cells).Clamp(index);
    }